

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O1

void riffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  ulong M_00;
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  sbyte sVar12;
  long StageCnt;
  byte bVar13;
  long lVar14;
  float *pfVar15;
  byte bVar16;
  uint uVar17;
  double dVar18;
  ulong uVar19;
  ulong uVar20;
  float *pfVar21;
  float *pfVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  float *pfVar27;
  ushort uVar28;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  ulong uVar29;
  
  auVar74 = _DAT_00108a40;
  dVar18 = (double)(0x3ff0000000000000 - (M << 0x34));
  auVar33._0_4_ = (float)dVar18;
  auVar33._4_4_ = (int)((ulong)dVar18 >> 0x20);
  auVar33._8_8_ = 0;
  M_00 = M - 1;
  switch(M) {
  case 0:
    break;
  case 1:
    if (0 < Rows) {
      lVar26 = Rows + 1;
      do {
        fVar1 = *ioptr;
        *ioptr = (ioptr[1] + fVar1) * auVar33._0_4_;
        ioptr[1] = (fVar1 - ioptr[1]) * auVar33._0_4_;
        ioptr = ioptr + (2L << (M_00 & 0x3f));
        lVar26 = lVar26 + -1;
      } while (1 < lVar26);
      Rows = 0;
    }
  case 2:
    auVar30 = _DAT_001089e0;
    auVar48 = _DAT_001089d0;
    if (0 < Rows) {
      lVar26 = Rows + 1;
      do {
        fVar1 = (float)*(undefined8 *)(ioptr + 2);
        fVar4 = (float)((ulong)*(undefined8 *)(ioptr + 2) >> 0x20);
        auVar32._0_4_ = fVar1 + fVar1;
        auVar32._4_4_ = fVar4 + fVar4;
        auVar32._8_8_ = 0;
        auVar34 = vpermt2ps_avx512vl(auVar32,auVar48,ZEXT416((uint)(ioptr[1] + *ioptr)));
        auVar31 = vinsertps_avx(auVar34,ZEXT416((uint)(*ioptr - ioptr[1])),0x30);
        auVar32 = vshufpd_avx(auVar31,auVar31,1);
        auVar35._0_4_ = auVar34._0_4_ + auVar32._0_4_;
        auVar35._4_4_ = auVar34._4_4_ + auVar32._4_4_;
        auVar35._8_4_ = auVar34._8_4_ + auVar32._8_4_;
        auVar35._12_4_ = auVar34._12_4_ + auVar32._12_4_;
        auVar31 = vsubps_avx(auVar31,auVar32);
        auVar31 = vpermt2ps_avx512vl(auVar35,auVar30,auVar31);
        *ioptr = auVar31._0_4_ * auVar33._0_4_;
        ioptr[1] = auVar31._4_4_ * auVar33._0_4_;
        ioptr[2] = auVar31._8_4_ * auVar33._0_4_;
        ioptr[3] = auVar31._12_4_ * auVar33._0_4_;
        ioptr = ioptr + (2L << (M_00 & 0x3f));
        lVar26 = lVar26 + -1;
      } while (1 < lVar26);
    }
    break;
  case 3:
    if (0 < Rows) {
      lVar26 = Rows + 1;
      do {
        fVar1 = ioptr[4] + ioptr[4];
        fVar4 = ioptr[5] + ioptr[5];
        fVar5 = ioptr[1] + *ioptr;
        fVar9 = *ioptr - ioptr[1];
        fVar8 = ioptr[6] + ioptr[2];
        fVar10 = ioptr[3] - ioptr[7];
        fVar6 = (ioptr[2] - ioptr[6]) * 0.70710677;
        fVar7 = (ioptr[7] + ioptr[3]) * -0.70710677;
        fVar11 = (fVar8 - fVar6) + fVar7;
        fVar7 = fVar10 + fVar6 + fVar7;
        auVar48 = vinsertps_avx(ZEXT416((uint)(fVar1 + fVar5)),ZEXT416((uint)(fVar9 - fVar4)),0x10);
        fVar11 = (fVar11 - (fVar8 + fVar8)) + fVar11;
        auVar30 = vinsertps_avx(ZEXT416((uint)(fVar8 + fVar8)),
                                ZEXT416((uint)((fVar7 - (fVar10 + fVar10)) + fVar7)),0x10);
        auVar30 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar5 - fVar1)),0x20);
        auVar48 = vinsertps_avx(auVar48,ZEXT416((uint)(fVar10 + fVar10)),0x20);
        auVar48 = vinsertps_avx(auVar48,ZEXT416((uint)(fVar4 + fVar9)),0x30);
        auVar70._16_16_ = auVar30;
        auVar70._0_16_ = auVar48;
        auVar71._4_4_ = fVar11;
        auVar71._0_4_ = fVar11;
        auVar71._8_4_ = fVar11;
        auVar71._12_4_ = fVar11;
        auVar71._16_4_ = fVar11;
        auVar71._20_4_ = fVar11;
        auVar71._24_4_ = fVar11;
        auVar71._28_4_ = fVar11;
        auVar71 = vblendps_avx(auVar70,auVar71,0x80);
        auVar49 = vpermpd_avx2(auVar71,0x4e);
        auVar72._0_4_ = auVar71._0_4_ + auVar49._0_4_;
        auVar72._4_4_ = auVar71._4_4_ + auVar49._4_4_;
        auVar72._8_4_ = auVar71._8_4_ + auVar49._8_4_;
        auVar72._12_4_ = auVar71._12_4_ + auVar49._12_4_;
        auVar72._16_4_ = auVar71._16_4_ + auVar49._16_4_;
        auVar72._20_4_ = auVar71._20_4_ + auVar49._20_4_;
        auVar72._24_4_ = auVar71._24_4_ + auVar49._24_4_;
        auVar72._28_4_ = auVar71._28_4_ + auVar49._28_4_;
        auVar71 = vsubps_avx(auVar70,auVar49);
        auVar49 = vpermt2ps_avx512vl(auVar72,auVar74,auVar71);
        *ioptr = auVar49._0_4_ * auVar33._0_4_;
        ioptr[1] = auVar49._4_4_ * auVar33._0_4_;
        ioptr[2] = auVar49._8_4_ * auVar33._0_4_;
        ioptr[3] = auVar49._12_4_ * auVar33._0_4_;
        ioptr[4] = auVar49._16_4_ * auVar33._0_4_;
        ioptr[5] = auVar49._20_4_ * auVar33._0_4_;
        ioptr[6] = auVar49._24_4_ * auVar33._0_4_;
        ioptr[7] = auVar71._28_4_;
        ioptr = ioptr + (2L << (M_00 & 0x3f));
        lVar26 = lVar26 + -1;
      } while (1 < lVar26);
    }
    break;
  case 4:
    if (0 < Rows) {
      auVar50 = vbroadcastss_avx512f(auVar33);
      lVar26 = Rows + 1;
      do {
        auVar30 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x20))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x20)
                                         ));
        auVar31 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x24))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x24)
                                         ));
        auVar32 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 4)),
                                 ZEXT416((uint)*(float *)*(undefined1 (*) [64])ioptr));
        auVar33 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x30))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x10)
                                         ));
        auVar48 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x14))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x34)
                                         ));
        auVar34 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x10))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x30)
                                         ));
        auVar35 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x34))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x14)
                                         ));
        fVar4 = auVar35._0_4_ * -0.70710677;
        auVar35 = ZEXT416((uint)(auVar34._0_4_ * 0.70710677));
        auVar34 = vsubss_avx512f(auVar33,auVar35);
        auVar34 = vaddss_avx512f(auVar34,ZEXT416((uint)fVar4));
        auVar35 = vaddss_avx512f(auVar48,auVar35);
        fVar1 = auVar33._0_4_ + auVar33._0_4_;
        auVar36 = vaddss_avx512f(auVar48,auVar48);
        auVar46 = ZEXT416((uint)(auVar35._0_4_ + fVar4));
        auVar35 = vsubss_avx512f(auVar46,auVar36);
        auVar48 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x38))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 8)));
        auVar37 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0xc)),
                                 ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x3c))
                                );
        auVar33 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 8)),
                                 ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x38))
                                );
        auVar38 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x3c))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0xc))
                                );
        auVar44 = SUB6416(ZEXT464(0xbec3ef15),0);
        auVar39 = vfmadd213ss_avx512f(auVar44,auVar33,auVar48);
        auVar45 = SUB6416(ZEXT464(0xbf6c835e),0);
        auVar39 = vfmadd231ss_avx512f(auVar39,auVar38,auVar45);
        auVar33 = vfmadd132ss_avx512f(auVar33,auVar37,SUB6416(ZEXT464(0x3f6c835e),0));
        auVar33 = vfmadd231ss_fma(auVar33,auVar44,auVar38);
        auVar73 = SUB6416(ZEXT464(0x40000000),0);
        auVar38 = vfmsub213ss_avx512f(auVar48,auVar73,auVar39);
        auVar37 = vfnmadd213ss_avx512f(auVar37,auVar73,auVar33);
        auVar40 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x28))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x18)
                                         ));
        auVar41 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x1c))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x2c)
                                         ));
        auVar48 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x18))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x28)
                                         ));
        auVar42 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x2c))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x1c)
                                         ));
        auVar43 = vfmadd213ss_avx512f(auVar45,auVar48,auVar40);
        auVar43 = vfmadd231ss_avx512f(auVar43,auVar42,auVar44);
        auVar48 = vfmadd132ss_avx512f(auVar48,auVar41,SUB6416(ZEXT464(0x3ec3ef15),0));
        auVar48 = vfmadd231ss_fma(auVar48,auVar45,auVar42);
        auVar40 = vfmsub213ss_avx512f(auVar40,auVar73,auVar43);
        auVar41 = vfnmadd213ss_avx512f(auVar41,auVar73,auVar48);
        auVar42 = vaddss_avx512f(auVar30,auVar32);
        auVar45 = ZEXT416((uint)(*(float *)*(undefined1 (*) [64])ioptr -
                                *(float *)((long)*(undefined1 (*) [64])ioptr + 4)));
        auVar44 = vsubss_avx512f(auVar45,auVar31);
        auVar30 = vsubss_avx512f(auVar32,auVar30);
        auVar31 = vaddss_avx512f(auVar31,auVar45);
        auVar32 = vsubss_avx512f(auVar34,ZEXT416((uint)fVar1));
        auVar32 = vaddss_avx512f(auVar32,auVar34);
        auVar34 = vaddss_avx512f(auVar35,auVar46);
        auVar35 = vaddss_avx512f(ZEXT416((uint)fVar1),auVar42);
        auVar45 = vaddss_avx512f(auVar34,auVar44);
        fVar1 = auVar42._0_4_ - fVar1;
        auVar34 = vsubss_avx512f(auVar44,auVar34);
        auVar42 = vaddss_avx512f(auVar36,auVar30);
        auVar44 = vsubss_avx512f(auVar31,auVar32);
        auVar36 = vsubss_avx512f(auVar30,auVar36);
        auVar46 = vaddss_avx512f(auVar32,auVar31);
        auVar30 = vaddss_avx512f(auVar39,auVar40);
        auVar31 = vaddss_avx512f(auVar33,auVar41);
        auVar32 = vsubss_avx512f(auVar39,auVar40);
        auVar33 = vsubss_avx512f(auVar33,auVar41);
        auVar39 = vsubss_avx512f(auVar43,auVar38);
        auVar40 = vsubss_avx512f(auVar48,auVar37);
        auVar38 = vaddss_avx512f(auVar38,auVar43);
        auVar48 = vaddss_avx512f(auVar37,auVar48);
        auVar37 = vaddss_avx512f(auVar38,auVar30);
        auVar41 = vaddss_avx512f(auVar48,auVar31);
        auVar38 = vsubss_avx512f(auVar30,auVar38);
        auVar43 = vsubss_avx512f(auVar31,auVar48);
        auVar48 = vaddss_avx512f(auVar40,auVar32);
        auVar30 = vsubss_avx512f(auVar33,auVar39);
        auVar31 = vsubss_avx512f(auVar32,auVar40);
        auVar33 = vaddss_avx512f(auVar39,auVar33);
        fVar4 = auVar31._0_4_ * 0.70710677;
        auVar32 = vsubss_avx512f(auVar36,ZEXT416((uint)fVar4));
        fVar5 = auVar33._0_4_ * 0.70710677;
        auVar33 = vmulss_avx512f(auVar48,SUB6416(ZEXT464(0x3f3504f3),0));
        auVar39 = vaddss_avx512f(auVar33,auVar42);
        auVar40 = vmulss_avx512f(auVar30,SUB6416(ZEXT464(0x3f3504f3),0));
        auVar47 = vsubss_avx512f(auVar44,auVar33);
        auVar33 = vsubss_avx512f(auVar35,auVar37);
        auVar48 = vsubss_avx512f(auVar45,auVar41);
        auVar30 = vinsertps_avx512f(auVar33,auVar48,0x10);
        auVar33 = vaddss_avx512f(auVar37,auVar35);
        auVar48 = vaddss_avx512f(auVar41,auVar45);
        auVar48 = vinsertps_avx512f(auVar33,auVar48,0x10);
        auVar33 = vaddss_avx512f(auVar43,ZEXT416((uint)fVar1));
        auVar31 = vsubss_avx512f(auVar34,auVar38);
        auVar31 = vinsertps_avx512f(auVar33,auVar31,0x10);
        auVar33 = vaddss_avx512f(auVar38,auVar34);
        auVar33 = vinsertps_avx(ZEXT416((uint)(fVar1 - auVar43._0_4_)),auVar33,0x10);
        auVar34 = vaddss_avx512f(auVar32,ZEXT416((uint)fVar5));
        auVar32 = vfmsub213ss_fma(auVar36,auVar73,auVar34);
        auVar48 = vinsertps_avx512f(auVar48,auVar32,0x20);
        auVar37 = ZEXT416((uint)(auVar46._0_4_ - (fVar4 + fVar5)));
        auVar32 = vfmsub213ss_fma(auVar46,auVar73,auVar37);
        auVar48 = vinsertps_avx(auVar48,auVar32,0x30);
        auVar35 = vaddss_avx512f(auVar39,auVar40);
        auVar36 = vaddss_avx512f(auVar47,auVar40);
        auVar32 = vfmsub213ss_fma(auVar42,auVar73,auVar35);
        auVar33 = vinsertps_avx(auVar33,auVar32,0x20);
        auVar32 = vfmsub213ss_avx512f(auVar44,auVar73,auVar36);
        auVar32 = vinsertps_avx512f(auVar33,auVar32,0x30);
        auVar33 = vinsertps_avx512f(auVar31,auVar35,0x20);
        auVar33 = vinsertps_avx(auVar33,auVar36,0x30);
        auVar30 = vinsertps_avx512f(auVar30,auVar34,0x20);
        auVar30 = vinsertps_avx(auVar30,auVar37,0x30);
        auVar74._16_16_ = auVar33;
        auVar74._0_16_ = auVar30;
        auVar51 = vinsertf64x4_avx512f(ZEXT3264(CONCAT1616(auVar32,auVar48)),auVar74,1);
        auVar51 = vmulps_avx512f(auVar51,auVar50);
        *(undefined1 (*) [64])ioptr = auVar51;
        ioptr = (float *)((long)*(undefined1 (*) [64])ioptr + (2L << (M_00 & 0x3f)) * 4);
        lVar26 = lVar26 + -1;
      } while (1 < lVar26);
    }
    break;
  default:
    if (0 < Rows) {
      uVar24 = 1L << (M_00 & 0x3f);
      uVar17 = (int)M - 3;
      lVar25 = 1L << ((ulong)uVar17 & 0x3f);
      bVar16 = (byte)uVar17;
      sVar12 = (bVar16 < 0x41) * ('@' - bVar16);
      uVar19 = -1L << (M - 2U & 0x3f);
      StageCnt = (long)(M - 2U) / 3;
      lVar26 = M + -2 + StageCnt * -3;
      lVar23 = 2L << (M_00 & 0x3f);
      auVar50 = vpbroadcastq_avx512f();
      auVar50 = vmovdqu64_avx512f(auVar50);
      pfVar22 = ioptr + uVar19 * -2 + -1;
      pfVar27 = ioptr + uVar24;
      do {
        pfVar15 = ioptr + (uVar24 >> 1);
        fVar1 = *ioptr;
        fVar4 = pfVar15[uVar24] + *pfVar15;
        fVar11 = pfVar15[1] - pfVar15[uVar24 + 1];
        fVar7 = Utbl[lVar25] * (*pfVar15 - pfVar15[uVar24]);
        auVar48._8_4_ = 0x80000000;
        auVar48._0_8_ = 0x8000000080000000;
        auVar48._12_4_ = 0x80000000;
        auVar48 = vxorps_avx512vl(ZEXT416((uint)Utbl[lVar25]),auVar48);
        fVar8 = (pfVar15[uVar24 + 1] + pfVar15[1]) * auVar48._0_4_;
        fVar5 = (fVar4 - fVar7) + fVar8;
        fVar8 = fVar11 + fVar7 + fVar8;
        auVar32 = SUB6416(ZEXT464(0x40000000),0);
        auVar30 = vfmsub132ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar5),auVar32);
        auVar48 = vfmadd132ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)fVar8),ZEXT416(0xc0000000));
        auVar31._0_4_ = (float)*(undefined8 *)(ioptr + uVar24) * 2.0;
        auVar31._4_4_ = (float)((ulong)*(undefined8 *)(ioptr + uVar24) >> 0x20) * -2.0;
        auVar31._8_8_ = 0;
        *ioptr = ioptr[1] + fVar1;
        ioptr[1] = fVar1 - ioptr[1];
        uVar2 = vmovlps_avx(auVar31);
        *(undefined8 *)(ioptr + uVar24) = uVar2;
        *pfVar15 = fVar5;
        pfVar15[1] = fVar8;
        pfVar15[uVar24] = auVar30._0_4_;
        pfVar15[uVar24 + 1] = auVar48._0_4_;
        if ((ulong)(-1L << sVar12) >> sVar12 != 0) {
          fVar4 = Utbl[~uVar19];
          fVar1 = Utbl[1];
          lVar14 = 1;
          pfVar15 = pfVar22;
          pfVar21 = Utbl + (-2 - uVar19);
          do {
            fVar5 = pfVar15[uVar24 - 1] + ioptr[lVar14 * 2];
            fVar8 = pfVar15[uVar24] + ioptr[lVar14 * 2 + 1];
            auVar34 = ZEXT416((uint)fVar4);
            auVar30 = ZEXT416((uint)(ioptr[lVar14 * 2] - pfVar15[uVar24 - 1]));
            auVar48 = vfnmsub231ss_fma(ZEXT416((uint)(fVar1 * fVar8)),auVar30,auVar34);
            fVar7 = fVar5 + auVar48._0_4_;
            auVar31 = ZEXT416((uint)(ioptr[lVar14 * 2 + 1] - pfVar15[uVar24]));
            auVar38 = ZEXT416((uint)fVar1);
            auVar48 = vfmadd213ss_fma(auVar30,auVar38,auVar31);
            auVar35 = vfnmadd231ss_fma(auVar48,auVar34,ZEXT416((uint)fVar8));
            auVar30 = vfmsub213ss_fma(ZEXT416((uint)fVar5),auVar32,ZEXT416((uint)fVar7));
            auVar31 = vfnmadd213ss_fma(auVar31,auVar32,auVar35);
            fVar1 = pfVar27[lVar14 * 2] + pfVar15[-1];
            fVar5 = pfVar27[lVar14 * 2 + 1] + *pfVar15;
            auVar36 = ZEXT416((uint)(pfVar15[-1] - pfVar27[lVar14 * 2]));
            auVar48 = vfnmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar4)),auVar36,auVar38);
            fVar8 = auVar48._0_4_ + fVar1;
            auVar37 = ZEXT416((uint)(*pfVar15 - pfVar27[lVar14 * 2 + 1]));
            auVar48 = vfmadd213ss_fma(auVar34,auVar36,auVar37);
            auVar36 = vfnmadd231ss_fma(auVar48,ZEXT416((uint)fVar5),auVar38);
            auVar48 = vfmsub213ss_fma(ZEXT416((uint)fVar1),auVar32,ZEXT416((uint)fVar8));
            auVar34 = vfnmadd213ss_fma(auVar37,auVar32,auVar36);
            ioptr[lVar14 * 2] = fVar7;
            ioptr[lVar14 * 2 + 1] = auVar35._0_4_;
            pfVar15[uVar24 - 1] = auVar30._0_4_;
            pfVar15[uVar24] = auVar31._0_4_;
            fVar1 = Utbl[lVar14 + 1];
            fVar4 = *pfVar21;
            pfVar15[-1] = fVar8;
            *pfVar15 = auVar36._0_4_;
            pfVar27[lVar14 * 2] = auVar48._0_4_;
            pfVar27[lVar14 * 2 + 1] = auVar34._0_4_;
            lVar14 = lVar14 + 1;
            pfVar21 = pfVar21 + -1;
            pfVar15 = pfVar15 + -2;
          } while (lVar25 != lVar14);
        }
        scbitrevR2(ioptr,M_00,BRLow,auVar33._0_4_);
        auVar51 = vmovdqu64_avx512f(auVar50);
        auVar52 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar53 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar20 = (ulong)(lVar26 == 1) * 2 + 2;
        if (2 < M_00 && lVar26 == 1) {
          uVar20 = 0;
          pfVar15 = ioptr;
          do {
            auVar54 = vpbroadcastq_avx512f();
            auVar55 = vporq_avx512f(auVar54,auVar52);
            auVar54 = vporq_avx512f(auVar54,auVar53);
            uVar2 = vpcmpuq_avx512f(auVar54,auVar51,2);
            bVar16 = (byte)uVar2;
            uVar2 = vpcmpuq_avx512f(auVar55,auVar51,2);
            bVar13 = (byte)uVar2;
            uVar28 = CONCAT11(bVar13,bVar16);
            uVar29 = (ulong)uVar28;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar15 + (long)Utbl));
            auVar55._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar55._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar55._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar55._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar55._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar55._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar55._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar55._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar55._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar55._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar55._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar55._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar55._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar55._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar55._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar55._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 4) + (long)Utbl));
            auVar58._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar58._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar58._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar58._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar58._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar58._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar58._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar58._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar58._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar58._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar58._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar58._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar58._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar58._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar58._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar58._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 1) + (long)Utbl));
            auVar59._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar59._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar59._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar59._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar59._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar59._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar59._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar59._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar59._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar59._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar59._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar59._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar59._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar59._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar59._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar59._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 5) + (long)Utbl));
            auVar60._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar60._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar60._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar60._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar60._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar60._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar60._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar60._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar60._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar60._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar60._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar60._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar60._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar60._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar60._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar60._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 8) + (long)Utbl));
            auVar61._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar61._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar61._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar61._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar61._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar61._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar61._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar61._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar61._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar61._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar61._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar61._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar61._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar61._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar61._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar61._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 0xc) + (long)Utbl));
            auVar68._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar68._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar68._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar68._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar68._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar68._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar68._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar68._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar68._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar68._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar68._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar68._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar68._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar68._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar68._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar68._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 9) + (long)Utbl));
            auVar69._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar69._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar69._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar69._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar69._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar69._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar69._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar69._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar69._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar69._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar69._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar69._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar69._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar69._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar69._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar69._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar56 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 0xd) + (long)Utbl));
            auVar54._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar56._4_4_;
            auVar54._0_4_ = (uint)(bVar16 & 1) * auVar56._0_4_;
            auVar54._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar56._8_4_;
            auVar54._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar56._12_4_;
            auVar54._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar56._16_4_;
            auVar54._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar56._20_4_;
            auVar54._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar56._24_4_;
            auVar54._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar56._28_4_;
            auVar54._32_4_ = (uint)(bVar13 & 1) * auVar56._32_4_;
            auVar54._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar56._36_4_;
            auVar54._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar56._40_4_;
            auVar54._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar56._44_4_;
            auVar54._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar56._48_4_;
            auVar54._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar56._52_4_;
            auVar54._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar56._56_4_;
            auVar54._60_4_ = (uint)(bVar13 >> 7) * auVar56._60_4_;
            auVar56 = vaddps_avx512f(auVar58,auVar55);
            auVar57 = vaddps_avx512f(auVar60,auVar59);
            auVar55 = vsubps_avx512f(auVar55,auVar58);
            auVar58 = vsubps_avx512f(auVar59,auVar60);
            auVar59 = vaddps_avx512f(auVar68,auVar61);
            auVar60 = vaddps_avx512f(auVar54,auVar69);
            auVar61 = vsubps_avx512f(auVar61,auVar68);
            auVar54 = vsubps_avx512f(auVar69,auVar54);
            vscatterdps_avx512f(ZEXT864(pfVar15) + _DAT_00108840,uVar29,auVar56);
            vscatterdps_avx512f(ZEXT864(pfVar15) + _DAT_00108880,uVar29,auVar57);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x10) + _DAT_00108840,uVar29,auVar55);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x10) + _DAT_00108880,uVar29,auVar58);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x20) + _DAT_00108840,uVar29,auVar59);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x20) + _DAT_00108880,uVar29,auVar60);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x30) + _DAT_00108840,uVar29,auVar61);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x30) + _DAT_00108880,uVar29,auVar54);
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar15 + (long)pfVar27));
            auVar56._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar56._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar56._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar56._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar56._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar56._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar56._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar56._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar56._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar56._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar56._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar56._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar56._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar56._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar56._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar56._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar15 * 2 + 0x10));
            auVar57._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar57._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar57._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar57._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar57._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar57._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar57._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar57._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar57._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar57._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar57._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar57._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar57._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar57._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar57._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar57._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar15 * 2));
            auVar62._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar62._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar62._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar62._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar62._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar62._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar62._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar62._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar62._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar62._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar62._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar62._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar62._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar62._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar62._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar62._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 4) + (long)pfVar27));
            auVar63._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar63._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar63._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar63._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar63._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar63._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar63._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar63._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar63._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar63._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar63._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar63._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar63._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar63._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar63._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar63._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 8) + (long)pfVar27));
            auVar64._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar64._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar64._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar64._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar64._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar64._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar64._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar64._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar64._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar64._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar64._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar64._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar64._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar64._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar64._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar64._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar15 * 2 + 0x30));
            auVar65._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar65._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar65._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar65._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar65._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar65._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar65._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar65._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar65._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar65._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar65._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar65._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar65._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar65._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar65._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar65._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar15 * 2 + 0x20));
            auVar66._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar66._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar66._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar66._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar66._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar66._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar66._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar66._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar66._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar66._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar66._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar66._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar66._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar66._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar66._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar66._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar15 + 0xc) + (long)pfVar27));
            auVar67._4_4_ = (uint)((byte)(uVar28 >> 1) & 1) * auVar54._4_4_;
            auVar67._0_4_ = (uint)(bVar16 & 1) * auVar54._0_4_;
            auVar67._8_4_ = (uint)((byte)(uVar28 >> 2) & 1) * auVar54._8_4_;
            auVar67._12_4_ = (uint)((byte)(uVar28 >> 3) & 1) * auVar54._12_4_;
            auVar67._16_4_ = (uint)((byte)(uVar28 >> 4) & 1) * auVar54._16_4_;
            auVar67._20_4_ = (uint)((byte)(uVar28 >> 5) & 1) * auVar54._20_4_;
            auVar67._24_4_ = (uint)((byte)(uVar28 >> 6) & 1) * auVar54._24_4_;
            auVar67._28_4_ = (uint)((byte)(uVar28 >> 7) & 1) * auVar54._28_4_;
            auVar67._32_4_ = (uint)(bVar13 & 1) * auVar54._32_4_;
            auVar67._36_4_ = (uint)(bVar13 >> 1 & 1) * auVar54._36_4_;
            auVar67._40_4_ = (uint)(bVar13 >> 2 & 1) * auVar54._40_4_;
            auVar67._44_4_ = (uint)(bVar13 >> 3 & 1) * auVar54._44_4_;
            auVar67._48_4_ = (uint)(bVar13 >> 4 & 1) * auVar54._48_4_;
            auVar67._52_4_ = (uint)(bVar13 >> 5 & 1) * auVar54._52_4_;
            auVar67._56_4_ = (uint)(bVar13 >> 6 & 1) * auVar54._56_4_;
            auVar67._60_4_ = (uint)(bVar13 >> 7) * auVar54._60_4_;
            auVar54 = vsubps_avx512f(auVar56,auVar57);
            auVar55 = vaddps_avx512f(auVar63,auVar62);
            auVar58 = vaddps_avx512f(auVar57,auVar56);
            auVar59 = vsubps_avx512f(auVar62,auVar63);
            auVar60 = vsubps_avx512f(auVar64,auVar65);
            auVar61 = vaddps_avx512f(auVar67,auVar66);
            auVar68 = vaddps_avx512f(auVar65,auVar64);
            auVar69 = vsubps_avx512f(auVar66,auVar67);
            vscatterdps_avx512f(ZEXT864(pfVar15) + _DAT_001088c0,uVar29,auVar54);
            vscatterdps_avx512f(ZEXT864(pfVar15) + auVar58,uVar29,auVar55);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x10) + _DAT_001088c0,uVar29,auVar58);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x10) + auVar58,uVar29,auVar59);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x20) + _DAT_001088c0,uVar29,auVar60);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x20) + auVar58,uVar29,auVar61);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x30) + _DAT_001088c0,uVar29,auVar68);
            vscatterdps_avx512f(ZEXT864(pfVar15) + ZEXT864(0x30) + auVar58,uVar29,auVar69);
            uVar20 = uVar20 + 0x10;
            pfVar15 = pfVar15 + 0x100;
          } while (((uVar24 >> 3) + 0xf & 0xfffffffffffffff0) != uVar20);
          uVar20 = 4;
        }
        if (lVar26 == 2) {
          ibfR4(ioptr,M_00,uVar20);
          uVar20 = (ulong)(uint)((int)uVar20 << 2);
        }
        if (M_00 < 0xc) {
          ibfstages(ioptr,M_00,Utbl,2,uVar20,StageCnt);
        }
        else {
          ifftrecurs(ioptr,M_00,Utbl,2,uVar20,StageCnt);
        }
        ioptr = ioptr + lVar23;
        pfVar22 = pfVar22 + lVar23;
        pfVar27 = pfVar27 + lVar23;
        bVar3 = 1 < Rows;
        Rows = Rows + -1;
      } while (bVar3);
    }
  }
  return;
}

Assistant:

void riffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place real ifft on the rows of the input array	*/
/* data order as from rffts1 */
/* INPUTS */
/* *ioptr = input data array in the following order	*/
/* M = log2 of fft size	*/
/* Re(x[0]), Re(x[N/2]), Re(x[1]), Im(x[1]), Re(x[2]), Im(x[2]), ... Re(x[N/2-1]), Im(x[N/2-1]). */
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = real output data array	*/

float	scale;
long 	StageCnt;
long 	NDiffU;

scale = 1.0/POW2(M);
M=M-1;
switch (M){
case -1:
	break;
case 0:
	for (;Rows>0;Rows--){
		rifft1pt(ioptr, scale);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
case 1:
	for (;Rows>0;Rows--){
		rifft2pt(ioptr, scale);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		rifft4pt(ioptr, scale);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		rifft8pt(ioptr, scale);				/* a 16 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	for (;Rows>0;Rows--){

		ifrstage(ioptr, M+1, Utbl);

		scbitrevR2(ioptr, M, BRLow, scale);						/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			ibfR2(ioptr, M, NDiffU);			/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			ibfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE){
			ibfstages(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		else{
			ifftrecurs(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		ioptr += 2*POW2(M);
	}
}
}